

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> * __thiscall
ChebTools::ChebyshevExpansion::subdivide
          (vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
           *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nintervals,size_t Norder)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  long lVar5;
  undefined8 *puVar6;
  ulong uVar7;
  char *__function;
  ulong uVar8;
  long lVar9;
  Index size;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  double xmin;
  VectorXd xrealworld;
  VectorXd xpts_n11;
  void *local_138;
  void *local_100;
  ulong local_f8;
  size_t local_f0;
  undefined1 local_e8 [32];
  ChebyshevExpansion local_c8;
  double local_88;
  undefined1 local_80;
  long local_78;
  undefined8 local_68;
  long local_58;
  void *local_48;
  
  if (Nintervals == 1) {
    std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
    vector(__return_storage_ptr__,1,this,(allocator_type *)(local_e8 + 0x20));
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar5 = Norder + 1;
    if (lVar5 < 0) {
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::linspaced_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
LAB_0013370e:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,__function);
    }
    auVar16._8_4_ = (int)(Norder >> 0x20);
    auVar16._0_8_ = Norder;
    auVar16._12_4_ = 0x45300000;
    dVar10 = this->m_xmax;
    local_c8.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data =
         (double *)
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)Norder) - 4503599627370496.0));
    local_88 = 0.0;
    if (Norder != 0) {
      local_88 = (double)local_c8.m_nodal_value_cache.
                         super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data / (double)(long)Norder;
    }
    dVar11 = this->m_xmin;
    local_c8.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = Norder + (Norder == 0);
    local_c8.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = 0;
    local_80 = 0;
    local_68 = 0x400921fb54442d18;
    local_f0 = Norder;
    local_c8.m_xmax = (double)lVar5;
    local_78 = lVar5;
    local_58 = lVar5;
    local_48 = local_c8.m_nodal_value_cache.
               super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_100,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)(local_e8 + 0x20));
    lVar5 = Nintervals - 1;
    if (lVar5 != 0) {
      auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)lVar5);
      auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar12._12_4_ = 0x45300000;
      dVar10 = (dVar10 - dVar11) /
               ((auVar12._8_8_ - 1.9342813113834067e+25) + (auVar12._0_8_ - 4503599627370496.0));
      lVar9 = 0;
      do {
        uVar4 = local_f8;
        if ((long)local_f8 < 0) {
          __function = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
          ;
          goto LAB_0013370e;
        }
        dVar11 = this->m_xmin;
        local_138 = (void *)0x0;
        if (local_f8 != 0) {
          free((void *)0x0);
          if (uVar4 == 0) {
            local_138 = (void *)0x0;
          }
          else {
            if (uVar4 >> 0x3d != 0) {
LAB_00133718:
              puVar6 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar6 = std::random_device::_M_fini;
              __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            local_138 = malloc(uVar4 * 8);
            if (uVar4 != 1 && ((ulong)local_138 & 0xf) != 0) {
              __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                            ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
            }
            if (local_138 == (void *)0x0) goto LAB_00133718;
          }
        }
        auVar13._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar13._0_8_ = lVar9;
        auVar13._12_4_ = 0x45300000;
        xmin = ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * dVar10 + dVar11;
        lVar9 = lVar9 + 1;
        auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar14._0_8_ = lVar9;
        auVar14._12_4_ = 0x45300000;
        local_e8._24_8_ = auVar14._8_8_ - 1.9342813113834067e+25;
        local_e8._16_8_ =
             ((double)local_e8._24_8_ +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * dVar10 + dVar11;
        dVar11 = (double)local_e8._16_8_ - xmin;
        dVar15 = (double)local_e8._16_8_ + xmin;
        uVar7 = uVar4 & 0x7ffffffffffffffe;
        if (1 < (long)uVar4) {
          uVar8 = 0;
          do {
            pdVar1 = (double *)((long)local_100 + uVar8 * 8);
            dVar3 = pdVar1[1];
            pdVar2 = (double *)((long)local_138 + uVar8 * 8);
            *pdVar2 = (*pdVar1 * dVar11 + dVar15) * 0.5;
            pdVar2[1] = (dVar3 * dVar11 + dVar15) * 0.5;
            uVar8 = uVar8 + 2;
          } while (uVar8 < uVar7);
        }
        if ((long)uVar7 < (long)uVar4) {
          do {
            *(double *)((long)local_138 + uVar7 * 8) =
                 (*(double *)((long)local_100 + uVar7 * 8) * dVar11 + dVar15) * 0.5;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        y((ChebyshevExpansion *)local_e8,&this->m_c);
        factoryf((ChebyshevExpansion *)(local_e8 + 0x20),local_f0,(VectorXd *)local_e8,xmin,
                 (double)local_e8._16_8_);
        std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
        emplace_back<ChebTools::ChebyshevExpansion>
                  (__return_storage_ptr__,(ChebyshevExpansion *)(local_e8 + 0x20));
        free(local_c8.m_nodal_value_cache.
             super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_c8.m_recurrence_buffer.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_c8.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        free((void *)local_e8._0_8_);
        free(local_138);
      } while (lVar9 != lVar5);
    }
    free(local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ChebyshevExpansion> ChebyshevExpansion::subdivide(std::size_t Nintervals, const std::size_t Norder) const {

        if (Nintervals == 1) {
            return std::vector<ChebyshevExpansion>(1, *this);
        }

        std::vector<ChebyshevExpansion> segments;
        double deltax = (m_xmax - m_xmin) / (Nintervals - 1);

        // Vector of values in the range [-1,1] as roots of a high-order Chebyshev
        double NN = static_cast<double>(Norder);
        Eigen::VectorXd xpts_n11 = (Eigen::VectorXd::LinSpaced(Norder + 1, 0, NN)*EIGEN_PI/NN).array().cos();

        for (std::size_t i = 0; i < Nintervals - 1; ++i) {
            double xmin = m_xmin + i*deltax, xmax = m_xmin + (i + 1)*deltax;
            Eigen::VectorXd xrealworld = ((xmax - xmin)*xpts_n11.array() + (xmax + xmin)) / 2.0;
            segments.push_back(factoryf(Norder, y(xrealworld), xmin, xmax));
        }
        return segments;
    }